

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O1

vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_> *
slack::_detail::json_to_elements
          (vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>
           *__return_storage_ptr__,Json *json)

{
  value_t vVar1;
  pointer pcVar2;
  bool bVar3;
  key_type *pkVar4;
  reference j;
  undefined8 uVar5;
  size_t sVar6;
  string label;
  const_iterator it;
  stringstream ss_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  undefined1 *local_218;
  long local_210;
  undefined1 local_208 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  const_iterator local_1d8;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->
  super__Vector_base<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vVar1 = json->m_type;
  sVar6 = (size_t)vVar1;
  if (vVar1 != null) {
    if (vVar1 == object) {
      sVar6 = (((json->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    }
    else if (vVar1 == array) {
      sVar6 = (long)(((json->m_value).array)->
                    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(((json->m_value).array)->
                    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4;
    }
    else {
      sVar6 = 1;
    }
  }
  std::vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>::reserve
            (__return_storage_ptr__,sVar6 + 1);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::cbegin(&local_1d8,json);
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend((const_iterator *)local_1b8,json);
    bVar3 = nlohmann::detail::
            iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::operator==(&local_1d8,(const_iterator *)local_1b8);
    if (bVar3) {
      return __return_storage_ptr__;
    }
    pkVar4 = nlohmann::detail::
             iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::key(&local_1d8);
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    pcVar2 = (pkVar4->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,pcVar2,pcVar2 + pkVar4->_M_string_length);
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    j = nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator*(&local_1d8);
    nlohmann::operator<<((ostream *)(local_1b8 + 0x10),j);
    std::__cxx11::stringbuf::str();
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_238,local_218,local_218 + local_210);
    if (*local_238._M_dataplus._M_p == '\"') {
      std::__cxx11::string::erase((ulong)&local_238,0);
      if (local_238._M_string_length == 0) {
        uVar5 = std::__throw_out_of_range_fmt
                          ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                           "basic_string::erase");
        std::vector<slack::_detail::Element,_std::allocator<slack::_detail::Element>_>::~vector
                  (__return_storage_ptr__);
        _Unwind_Resume(uVar5);
      }
      local_238._M_dataplus._M_p[local_238._M_string_length - 1] = '\0';
      local_238._M_string_length = local_238._M_string_length - 1;
    }
    std::vector<slack::_detail::Element,std::allocator<slack::_detail::Element>>::
    emplace_back<std::__cxx11::string&,std::__cxx11::string>
              ((vector<slack::_detail::Element,std::allocator<slack::_detail::Element>> *)
               __return_storage_ptr__,&local_1f8,&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if (local_218 != local_208) {
      operator_delete(local_218);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    nlohmann::detail::
    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::operator++(&local_1d8);
  } while( true );
}

Assistant:

inline
auto json_to_elements(const Json& json) -> std::vector<Element> {
    auto elements = std::vector<Element>{};
    elements.reserve(json.size() + 1); // +1 for token
    for (auto it = json.begin(); it != json.end(); ++ it) { 
        std::string label = it.key();
        std::stringstream ss_value;
        ss_value << it.value();
        elements.emplace_back(label, remove_first_last_quote(ss_value.str()));
    }
    return elements;
}